

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlRelaxNGGrammarPtr_conflict pxVar3;
  int iVar4;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr pxVar7;
  xmlChar *pxVar8;
  xmlHashTablePtr pxVar9;
  void *pvVar10;
  xmlChar *pxVar11;
  xmlRelaxNGDefinePtr *ppxVar12;
  xmlRelaxNGDefinePtr_conflict pxVar13;
  xmlNodePtr pxVar14;
  xmlRelaxNGGrammarPtr_conflict pxVar15;
  xmlRelaxNGPtr pxVar16;
  uint uVar17;
  char *pcVar18;
  xmlNs *pxVar19;
  xmlNode *node_00;
  _xmlNode *p_Var20;
  xmlRelaxNGDefinePtr_conflict pxVar21;
  bool bVar22;
  xmlChar *local_50;
  xmlRelaxNGDefinePtr_conflict local_48;
  xmlRelaxNGDefinePtr local_38;
  
  if ((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) {
LAB_0017eae0:
    pxVar8 = node->name;
    pcVar18 = "Unexpected node %s is not a pattern\n";
    pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
    iVar4 = 0x45b;
  }
  else {
    iVar4 = xmlStrEqual(node->name,"element");
    pxVar19 = node->ns;
    if (iVar4 != 0) {
      iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar4 != 0) {
        pxVar5 = xmlRelaxNGParseElement(ctxt,node);
        return pxVar5;
      }
      pxVar19 = node->ns;
    }
    if ((pxVar19 == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) goto LAB_0017eae0;
    iVar4 = xmlStrEqual(node->name,"attribute");
    pxVar19 = node->ns;
    if (iVar4 == 0) {
LAB_0017d9f5:
      if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
        iVar4 = xmlStrEqual(node->name,"empty");
        pxVar19 = node->ns;
        if (iVar4 != 0) {
          iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar4 != 0) {
            pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
            if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
              return (xmlRelaxNGDefinePtr_conflict)0x0;
            }
            pxVar5->type = XML_RELAXNG_EMPTY;
            if (node->children == (_xmlNode *)0x0) {
              return pxVar5;
            }
            pcVar18 = "empty: had a child node\n";
            iVar4 = 0x401;
            goto LAB_0017da80;
          }
          pxVar19 = node->ns;
        }
        if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
          iVar4 = xmlStrEqual(node->name,"text");
          pxVar19 = node->ns;
          if (iVar4 != 0) {
            iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
            if (iVar4 != 0) {
              pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              pxVar5->type = XML_RELAXNG_TEXT;
              if (node->children == (_xmlNode *)0x0) {
                return pxVar5;
              }
              pcVar18 = "text: had a child node\n";
              iVar4 = 0x455;
              goto LAB_0017da80;
            }
            pxVar19 = node->ns;
          }
          if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
            iVar4 = xmlStrEqual(node->name,(xmlChar *)"zeroOrMore");
            pxVar19 = node->ns;
            if (iVar4 != 0) {
              iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
              if (iVar4 == 0) {
                pxVar19 = node->ns;
                goto LAB_0017dbd8;
              }
              pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              pxVar5->type = XML_RELAXNG_ZEROORMORE;
LAB_0017db91:
              p_Var20 = node->children;
              if (p_Var20 != (_xmlNode *)0x0) {
                iVar4 = 1;
LAB_0017dba4:
                pxVar7 = xmlRelaxNGParsePatterns(ctxt,p_Var20,iVar4);
                goto LAB_0017dba9;
              }
LAB_0017dd14:
              pxVar8 = node->name;
              pcVar18 = "Element %s is empty\n";
              iVar4 = 0x3ff;
              goto LAB_0017eaf9;
            }
LAB_0017dbd8:
            if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
              iVar4 = xmlStrEqual(node->name,(xmlChar *)"oneOrMore");
              pxVar19 = node->ns;
              if (iVar4 != 0) {
                iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
                if (iVar4 != 0) {
                  pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                  if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                    return (xmlRelaxNGDefinePtr_conflict)0x0;
                  }
                  pxVar5->type = XML_RELAXNG_ONEORMORE;
                  goto LAB_0017db91;
                }
                pxVar19 = node->ns;
              }
              if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                iVar4 = xmlStrEqual(node->name,(xmlChar *)"optional");
                pxVar19 = node->ns;
                if (iVar4 != 0) {
                  iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"
                                     );
                  if (iVar4 != 0) {
                    pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                    if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                    }
                    pxVar5->type = XML_RELAXNG_OPTIONAL;
                    goto LAB_0017db91;
                  }
                  pxVar19 = node->ns;
                }
                if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                  iVar4 = xmlStrEqual(node->name,(xmlChar *)"choice");
                  pxVar19 = node->ns;
                  if (iVar4 != 0) {
                    iVar4 = xmlStrEqual(pxVar19->href,
                                        (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                    if (iVar4 == 0) {
                      pxVar19 = node->ns;
                      goto LAB_0017dd33;
                    }
                    pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                    if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                    }
                    pxVar5->type = XML_RELAXNG_CHOICE;
LAB_0017dd01:
                    p_Var20 = node->children;
                    if (p_Var20 == (_xmlNode *)0x0) goto LAB_0017dd14;
                    iVar4 = 0;
                    goto LAB_0017dba4;
                  }
LAB_0017dd33:
                  if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                    iVar4 = xmlStrEqual(node->name,"group");
                    pxVar19 = node->ns;
                    if (iVar4 != 0) {
                      iVar4 = xmlStrEqual(pxVar19->href,
                                          (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                      if (iVar4 != 0) {
                        pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                        if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                        }
                        pxVar5->type = XML_RELAXNG_GROUP;
                        goto LAB_0017dd01;
                      }
                      pxVar19 = node->ns;
                    }
                    if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                      iVar4 = xmlStrEqual(node->name,"ref");
                      pxVar19 = node->ns;
                      if (iVar4 != 0) {
                        iVar4 = xmlStrEqual(pxVar19->href,
                                            (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                        if (iVar4 == 0) {
                          pxVar19 = node->ns;
                          goto LAB_0017de50;
                        }
                        pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                        if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                        }
                        pxVar5->type = XML_RELAXNG_REF;
                        pxVar8 = xmlGetProp(node,"name");
                        pxVar5->name = pxVar8;
                        if (pxVar8 == (xmlChar *)0x0) {
                          pcVar18 = "ref has no name\n";
                          iVar4 = 0x44e;
                          pxVar8 = (xmlChar *)0x0;
LAB_0017dfdd:
                          xmlRngPErr(ctxt,node,iVar4,pcVar18,pxVar8,(xmlChar *)0x0);
                        }
                        else {
                          xmlRelaxNGNormExtSpace(pxVar8);
                          iVar4 = xmlValidateNCName(pxVar5->name,0);
                          if (iVar4 != 0) {
                            pxVar8 = pxVar5->name;
                            pcVar18 = "ref name \'%s\' is not an NCName\n";
                            iVar4 = 0x44c;
                            goto LAB_0017dfdd;
                          }
                        }
                        if (node->children != (_xmlNode *)0x0) {
                          xmlRngPErr(ctxt,node,0x44f,"ref is not empty\n",(xmlChar *)0x0,
                                     (xmlChar *)0x0);
                        }
                        pxVar9 = ctxt->grammar->refs;
                        if (pxVar9 == (xmlHashTablePtr)0x0) {
                          pxVar9 = xmlHashCreate(10);
                          ctxt->grammar->refs = pxVar9;
                          if (pxVar9 != (xmlHashTablePtr)0x0) goto LAB_0017e032;
                          pcVar18 = "Could not create references hash\n";
LAB_0017e21d:
                          pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                          iVar4 = 0x44a;
                          goto LAB_0017da80;
                        }
LAB_0017e032:
                        iVar4 = xmlHashAddEntry(pxVar9,pxVar5->name,pxVar5);
                        if (-1 < iVar4) {
                          return pxVar5;
                        }
                        pvVar10 = xmlHashLookup(ctxt->grammar->refs,pxVar5->name);
                        if (pvVar10 != (void *)0x0) goto LAB_0017e060;
                        pxVar8 = pxVar5->name;
                        if (pxVar8 == (xmlChar *)0x0) {
                          pcVar18 = "Error refs definitions\n";
                          goto LAB_0017e21d;
                        }
                        pcVar18 = "Error refs definitions \'%s\'\n";
                        pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                        iVar4 = 0x44a;
                        goto LAB_0017eaf9;
                      }
LAB_0017de50:
                      if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                        iVar4 = xmlStrEqual(node->name,(xmlChar *)"data");
                        pxVar19 = node->ns;
                        if (iVar4 != 0) {
                          iVar4 = xmlStrEqual(pxVar19->href,
                                              (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                          if (iVar4 != 0) {
                            pxVar8 = xmlGetProp(node,"type");
                            if (pxVar8 != (xmlChar *)0x0) {
                              xmlRelaxNGNormExtSpace(pxVar8);
                              pxVar14 = (xmlNodePtr)0x0;
                              iVar4 = xmlValidateNCName(pxVar8,0);
                              if (iVar4 != 0) {
                                pxVar14 = node;
                                xmlRngPErr(ctxt,node,0x458,"data type \'%s\' is not an NCName\n",
                                           pxVar8,(xmlChar *)0x0);
                              }
                              local_50 = xmlRelaxNGGetDataTypeLibrary
                                                   ((xmlRelaxNGParserCtxtPtr)node,pxVar14);
                              if (local_50 == (xmlChar *)0x0) {
                                local_50 = xmlStrdup((xmlChar *)
                                                     "http://relaxng.org/ns/structure/1.0");
                              }
                              pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                              if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                (*xmlFree)(local_50);
                                (*xmlFree)(pxVar8);
                                return (xmlRelaxNGDefinePtr_conflict)0x0;
                              }
                              pxVar5->type = XML_RELAXNG_DATATYPE;
                              pxVar5->name = pxVar8;
                              pxVar5->ns = local_50;
                              pvVar10 = xmlHashLookup(xmlRelaxNGRegisteredTypes,local_50);
                              if (pvVar10 == (void *)0x0) {
                                xmlRngPErr(ctxt,node,0x45c,
                                           "Use of unregistered type library \'%s\'\n",local_50,
                                           (xmlChar *)0x0);
                                pxVar5->data = (void *)0x0;
                              }
                              else {
                                pxVar5->data = pvVar10;
                                if (*(code **)((long)pvVar10 + 0x10) == (code *)0x0) {
                                  pcVar18 = "Internal error with type library \'%s\': no \'have\'\n"
                                  ;
                                  iVar4 = 0x402;
                                  pxVar11 = (xmlChar *)0x0;
                                  pxVar8 = local_50;
                                }
                                else {
                                  iVar4 = (**(code **)((long)pvVar10 + 0x10))
                                                    (*(undefined8 *)((long)pvVar10 + 8),pxVar5->name
                                                    );
                                  if (iVar4 == 1) {
                                    iVar4 = xmlStrEqual(local_50,(xmlChar *)
                                                                                                                                  
                                                  "http://www.w3.org/2001/XMLSchema-datatypes");
                                    if ((iVar4 != 0) &&
                                       ((iVar4 = xmlStrEqual(pxVar5->name,"IDREF"), iVar4 != 0 ||
                                        (iVar4 = xmlStrEqual(pxVar5->name,"IDREFS"), iVar4 != 0))))
                                    {
                                      ctxt->idref = 1;
                                    }
                                    goto LAB_0017e303;
                                  }
                                  pcVar18 = 
                                  "Error type \'%s\' is not exported by type library \'%s\'\n";
                                  iVar4 = 0x457;
                                  pxVar8 = pxVar5->name;
                                  pxVar11 = local_50;
                                }
                                xmlRngPErr(ctxt,node,iVar4,pcVar18,pxVar8,pxVar11);
                              }
LAB_0017e303:
                              node_00 = node->children;
                              local_48 = (xmlRelaxNGDefinePtr_conflict)0x0;
LAB_0017e31d:
                              if (node_00 == (xmlNode *)0x0) {
                                return pxVar5;
                              }
                              iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"param");
                              if (iVar4 != 0) goto code_r0x0017e33a;
                              iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"except");
                              if (iVar4 != 0) {
                                pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
                                if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                  return pxVar5;
                                }
                                pxVar6->type = XML_RELAXNG_EXCEPT;
                                p_Var20 = node_00->children;
                                pxVar5->content = pxVar6;
                                if (p_Var20 == (_xmlNode *)0x0) {
                                  xmlRngPErr(ctxt,node_00,0x406,"except has no content\n",
                                             (xmlChar *)0x0,(xmlChar *)0x0);
                                }
                                pxVar21 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                for (; p_Var20 != (xmlNodePtr)0x0; p_Var20 = p_Var20->next) {
                                  pxVar13 = xmlRelaxNGParsePattern(ctxt,p_Var20);
                                  if (pxVar13 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                                    ppxVar12 = &pxVar21->next;
                                    if (pxVar21 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                      ppxVar12 = &pxVar6->content;
                                    }
                                    *ppxVar12 = pxVar13;
                                    pxVar21 = pxVar13;
                                  }
                                }
                                node_00 = node_00->next;
                                if (node_00 == (xmlNode *)0x0) {
                                  return pxVar5;
                                }
                              }
                              pxVar8 = node_00->name;
                              pcVar18 = "Element data has unexpected content %s\n";
                              iVar4 = 0x3f1;
                              node = node_00;
                              goto LAB_0017eaf9;
                            }
                            pcVar18 = "data has no type\n";
                            pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                            iVar4 = 0x456;
                            goto LAB_0017da80;
                          }
                          pxVar19 = node->ns;
                        }
                        if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                          iVar4 = xmlStrEqual(node->name,"value");
                          pxVar19 = node->ns;
                          if (iVar4 != 0) {
                            iVar4 = xmlStrEqual(pxVar19->href,
                                                (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                            if (iVar4 != 0) {
                              pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                              if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                return (xmlRelaxNGDefinePtr_conflict)0x0;
                              }
                              pxVar5->type = XML_RELAXNG_VALUE;
                              pxVar8 = xmlGetProp(node,"type");
                              if (pxVar8 == (xmlChar *)0x0) {
                                pvVar10 = (void *)0x0;
LAB_0017e4f2:
                                bVar22 = false;
                              }
                              else {
                                xmlRelaxNGNormExtSpace(pxVar8);
                                pxVar14 = (xmlNodePtr)0x0;
                                iVar4 = xmlValidateNCName(pxVar8,0);
                                if (iVar4 != 0) {
                                  pxVar14 = node;
                                  xmlRngPErr(ctxt,node,0x458,"value type \'%s\' is not an NCName\n",
                                             pxVar8,(xmlChar *)0x0);
                                }
                                pxVar11 = xmlRelaxNGGetDataTypeLibrary
                                                    ((xmlRelaxNGParserCtxtPtr)node,pxVar14);
                                if (pxVar11 == (xmlChar *)0x0) {
                                  pxVar11 = xmlStrdup((xmlChar *)
                                                      "http://relaxng.org/ns/structure/1.0");
                                }
                                pxVar5->name = pxVar8;
                                pxVar5->ns = pxVar11;
                                pvVar10 = xmlHashLookup(xmlRelaxNGRegisteredTypes,pxVar11);
                                if (pvVar10 == (void *)0x0) {
                                  pvVar10 = (void *)0x0;
                                  xmlRngPErr(ctxt,node,0x45c,
                                             "Use of unregistered type library \'%s\'\n",pxVar11,
                                             (xmlChar *)0x0);
                                  pxVar5->data = (void *)0x0;
                                  goto LAB_0017e4f2;
                                }
                                pxVar5->data = pvVar10;
                                if (*(code **)((long)pvVar10 + 0x10) == (code *)0x0) {
                                  bVar22 = false;
                                  xmlRngPErr(ctxt,node,0x402,
                                             "Internal error with type library \'%s\': no \'have\'\n"
                                             ,pxVar11,(xmlChar *)0x0);
                                }
                                else {
                                  iVar4 = (**(code **)((long)pvVar10 + 0x10))
                                                    (*(undefined8 *)((long)pvVar10 + 8),pxVar5->name
                                                    );
                                  bVar22 = true;
                                  if (iVar4 != 1) {
                                    xmlRngPErr(ctxt,node,0x457,
                                               "Error type \'%s\' is not exported by type library \'%s\'\n"
                                               ,pxVar5->name,pxVar11);
                                    goto LAB_0017e4f2;
                                  }
                                }
                              }
                              p_Var20 = node->children;
                              if (p_Var20 == (_xmlNode *)0x0) {
                                pxVar8 = xmlStrdup("");
                                pxVar5->value = pxVar8;
                                return pxVar5;
                              }
                              if ((p_Var20->type - XML_TEXT_NODE < 2) &&
                                 (p_Var20->next == (_xmlNode *)0x0)) {
                                pxVar8 = xmlNodeGetContent(node);
                                pxVar5->value = pxVar8;
                                if (pxVar8 != (xmlChar *)0x0) {
                                  if (pvVar10 == (void *)0x0) {
                                    return pxVar5;
                                  }
                                  if (!bVar22 || *(code **)((long)pvVar10 + 0x18) == (code *)0x0) {
                                    return pxVar5;
                                  }
                                  local_38 = (xmlRelaxNGDefinePtr)0x0;
                                  iVar4 = (**(code **)((long)pvVar10 + 0x18))
                                                    (*(undefined8 *)((long)pvVar10 + 8),pxVar5->name
                                                     ,pxVar8,&local_38,node);
                                  if (iVar4 == 1) {
                                    if (local_38 != (xmlRelaxNGDefinePtr)0x0) {
                                      pxVar5->attrs = local_38;
                                      return pxVar5;
                                    }
                                    return pxVar5;
                                  }
                                  pxVar11 = pxVar5->name;
                                  pxVar8 = pxVar5->value;
                                  pcVar18 = "Value \'%s\' is not acceptable for type \'%s\'\n";
                                  iVar4 = 0x41b;
                                  goto LAB_0017eafc;
                                }
                                pcVar18 = "Element <value> has no content\n";
                                iVar4 = 0x460;
                              }
                              else {
                                pcVar18 = "Expecting a single text value for <value>content\n";
                                iVar4 = 0x454;
                              }
                              goto LAB_0017da80;
                            }
                            pxVar19 = node->ns;
                          }
                          if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                            iVar4 = xmlStrEqual(node->name,"list");
                            pxVar19 = node->ns;
                            if (iVar4 != 0) {
                              iVar4 = xmlStrEqual(pxVar19->href,
                                                  (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                              if (iVar4 != 0) {
                                pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                                if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                  return (xmlRelaxNGDefinePtr_conflict)0x0;
                                }
                                pxVar5->type = XML_RELAXNG_LIST;
                                goto LAB_0017dd01;
                              }
                              pxVar19 = node->ns;
                            }
                            if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                              iVar4 = xmlStrEqual(node->name,(xmlChar *)"interleave");
                              pxVar19 = node->ns;
                              if (iVar4 != 0) {
                                iVar4 = xmlStrEqual(pxVar19->href,
                                                    (xmlChar *)"http://relaxng.org/ns/structure/1.0"
                                                   );
                                if (iVar4 != 0) {
                                  pxVar5 = xmlRelaxNGParseInterleave(ctxt,node);
                                  return pxVar5;
                                }
                                pxVar19 = node->ns;
                              }
                              if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                                iVar4 = xmlStrEqual(node->name,(xmlChar *)"externalRef");
                                pxVar19 = node->ns;
                                if (iVar4 != 0) {
                                  iVar4 = xmlStrEqual(pxVar19->href,
                                                      (xmlChar *)
                                                      "http://relaxng.org/ns/structure/1.0");
                                  if (iVar4 != 0) {
                                    pvVar10 = node->psvi;
                                    if (pvVar10 == (void *)0x0) {
                                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                                    }
                                    pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                                    if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                                    }
                                    pxVar5->type = XML_RELAXNG_EXTERNALREF;
                                    if (*(long *)((long)pvVar10 + 0x18) == 0) {
                                      pxVar14 = xmlDocGetRootElement
                                                          (*(xmlDoc **)((long)pvVar10 + 0x10));
                                      if (pxVar14 == (xmlNodePtr)0x0) {
                                        pxVar8 = ctxt->URL;
                                        pcVar18 = "xmlRelaxNGParse: %s is empty\n";
                                        pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                        iVar4 = 0x407;
                                        goto LAB_0017eaf9;
                                      }
                                      pxVar8 = xmlGetProp(pxVar14,"ns");
                                      bVar22 = pxVar8 == (xmlChar *)0x0;
                                      if (bVar22) {
                                        for (; (node != (xmlNode *)0x0 &&
                                               (node->type == XML_ELEMENT_NODE));
                                            node = node->parent) {
                                          pxVar8 = xmlGetProp(node,"ns");
                                          if (pxVar8 != (xmlChar *)0x0) {
                                            xmlSetProp(pxVar14,"ns",pxVar8);
                                            goto LAB_0017e7b6;
                                          }
                                        }
                                        bVar22 = false;
                                      }
                                      else {
LAB_0017e7b6:
                                        (*xmlFree)(pxVar8);
                                      }
                                      uVar1 = ctxt->flags;
                                      ctxt->flags = uVar1 | 0x80;
                                      pxVar16 = xmlRelaxNGParseDocument(ctxt,pxVar14);
                                      *(xmlRelaxNGPtr *)((long)pvVar10 + 0x20) = pxVar16;
                                      ctxt->flags = uVar1;
                                      if ((pxVar16 != (xmlRelaxNGPtr)0x0) &&
                                         (pxVar3 = pxVar16->topgrammar,
                                         pxVar3 != (xmlRelaxNGGrammarPtr_conflict)0x0)) {
                                        *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar10 + 0x18) =
                                             pxVar3->start;
                                        pxVar9 = pxVar3->refs;
                                        if ((pxVar9 != (xmlHashTablePtr)0x0) &&
                                           (ctxt->grammar != (xmlRelaxNGGrammarPtr_conflict)0x0)) {
                                          if (ctxt->grammar->refs == (xmlHashTablePtr)0x0) {
                                            pxVar9 = xmlHashCreate(10);
                                            ctxt->grammar->refs = pxVar9;
                                            if (pxVar9 == (xmlHashTablePtr)0x0) {
                                              xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x44a,
                                                         "Could not create references hash\n",
                                                         (xmlChar *)0x0,(xmlChar *)0x0);
                                              goto LAB_0017e91e;
                                            }
                                            pxVar9 = pxVar3->refs;
                                          }
                                          xmlHashScan(pxVar9,xmlRelaxNGParseImportRef,ctxt);
                                        }
                                      }
LAB_0017e91e:
                                      if (bVar22) {
                                        xmlUnsetProp(pxVar14,"ns");
                                      }
                                    }
                                    pxVar7 = *(xmlRelaxNGDefinePtr *)((long)pvVar10 + 0x18);
                                    goto LAB_0017dba9;
                                  }
                                  pxVar19 = node->ns;
                                }
                                if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                                  iVar4 = xmlStrEqual(node->name,(xmlChar *)"notAllowed");
                                  pxVar19 = node->ns;
                                  if (iVar4 != 0) {
                                    iVar4 = xmlStrEqual(pxVar19->href,
                                                        (xmlChar *)
                                                        "http://relaxng.org/ns/structure/1.0");
                                    if (iVar4 != 0) {
                                      pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                                      if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                        return (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      pxVar5->type = XML_RELAXNG_NOT_ALLOWED;
                                      if (node->children == (_xmlNode *)0x0) {
                                        return pxVar5;
                                      }
                                      pcVar18 = "xmlRelaxNGParse: notAllowed element is not empty\n"
                                      ;
                                      iVar4 = 0x41f;
                                      goto LAB_0017da80;
                                    }
                                    pxVar19 = node->ns;
                                  }
                                  if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE))
                                  {
                                    iVar4 = xmlStrEqual(node->name,"grammar");
                                    pxVar19 = node->ns;
                                    if (iVar4 != 0) {
                                      iVar4 = xmlStrEqual(pxVar19->href,
                                                          (xmlChar *)
                                                          "http://relaxng.org/ns/structure/1.0");
                                      if (iVar4 != 0) {
                                        pxVar3 = ctxt->grammar;
                                        pxVar2 = ctxt->parentgrammar;
                                        ctxt->parentgrammar = pxVar3;
                                        pxVar15 = xmlRelaxNGParseGrammar(ctxt,node->children);
                                        if (pxVar3 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                          ctxt->grammar = pxVar3;
                                          ctxt->parentgrammar = pxVar2;
                                        }
                                        if (pxVar15 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                                        }
                                        return pxVar15->start;
                                      }
                                      pxVar19 = node->ns;
                                    }
                                    if ((pxVar19 != (xmlNs *)0x0) &&
                                       (node->type == XML_ELEMENT_NODE)) {
                                      iVar4 = xmlStrEqual(node->name,"parentRef");
                                      pxVar19 = node->ns;
                                      if (iVar4 != 0) {
                                        iVar4 = xmlStrEqual(pxVar19->href,
                                                            (xmlChar *)
                                                            "http://relaxng.org/ns/structure/1.0");
                                        if (iVar4 != 0) {
                                          if (ctxt->parentgrammar ==
                                              (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                            pcVar18 = "Use of parentRef without a parent grammar\n";
                                            pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                            iVar4 = 0x427;
                                            goto LAB_0017da80;
                                          }
                                          pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
                                          if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return (xmlRelaxNGDefinePtr_conflict)0x0;
                                          }
                                          pxVar5->type = XML_RELAXNG_PARENTREF;
                                          pxVar8 = xmlGetProp(node,"name");
                                          pxVar5->name = pxVar8;
                                          if (pxVar8 == (xmlChar *)0x0) {
                                            pcVar18 = "parentRef has no name\n";
                                            iVar4 = 0x426;
                                            pxVar8 = (xmlChar *)0x0;
LAB_0017eb63:
                                            xmlRngPErr(ctxt,node,iVar4,pcVar18,pxVar8,(xmlChar *)0x0
                                                      );
                                          }
                                          else {
                                            xmlRelaxNGNormExtSpace(pxVar8);
                                            iVar4 = xmlValidateNCName(pxVar5->name,0);
                                            if (iVar4 != 0) {
                                              pxVar8 = pxVar5->name;
                                              pcVar18 = "parentRef name \'%s\' is not an NCName\n";
                                              iVar4 = 0x425;
                                              goto LAB_0017eb63;
                                            }
                                          }
                                          if (node->children != (_xmlNode *)0x0) {
                                            xmlRngPErr(ctxt,node,0x428,"parentRef is not empty\n",
                                                       (xmlChar *)0x0,(xmlChar *)0x0);
                                          }
                                          pxVar9 = ctxt->parentgrammar->refs;
                                          if (pxVar9 == (xmlHashTablePtr)0x0) {
                                            pxVar9 = xmlHashCreate(10);
                                            ctxt->parentgrammar->refs = pxVar9;
                                            if (pxVar9 == (xmlHashTablePtr)0x0) {
                                              pcVar18 = "Could not create references hash\n";
                                              pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                              iVar4 = 0x424;
                                              goto LAB_0017da80;
                                            }
                                          }
                                          if (pxVar5->name == (xmlChar *)0x0) {
                                            return pxVar5;
                                          }
                                          iVar4 = xmlHashAddEntry(pxVar9,pxVar5->name,pxVar5);
                                          if (-1 < iVar4) {
                                            return pxVar5;
                                          }
                                          pvVar10 = xmlHashLookup(ctxt->parentgrammar->refs,
                                                                  pxVar5->name);
                                          if (pvVar10 != (void *)0x0) {
LAB_0017e060:
                                            pxVar5->nextHash =
                                                 *(xmlRelaxNGDefinePtr *)((long)pvVar10 + 0x58);
                                            *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar10 + 0x58)
                                                 = pxVar5;
                                            return pxVar5;
                                          }
                                          pxVar8 = pxVar5->name;
                                          pcVar18 = "Internal error parentRef definitions \'%s\'\n";
                                          pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                          iVar4 = 0x424;
                                          goto LAB_0017eaf9;
                                        }
                                        pxVar19 = node->ns;
                                      }
                                      if ((((pxVar19 != (xmlNs *)0x0) &&
                                           (node->type == XML_ELEMENT_NODE)) &&
                                          (iVar4 = xmlStrEqual(node->name,(xmlChar *)"mixed"),
                                          iVar4 != 0)) &&
                                         (iVar4 = xmlStrEqual(node->ns->href,
                                                              (xmlChar *)
                                                              "http://relaxng.org/ns/structure/1.0")
                                         , iVar4 != 0)) {
                                        if (node->children != (_xmlNode *)0x0) {
                                          pxVar5 = xmlRelaxNGParseInterleave(ctxt,node);
                                          if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return (xmlRelaxNGDefinePtr_conflict)0x0;
                                          }
                                          if (((pxVar5->content != (xmlRelaxNGDefinePtr)0x0) &&
                                              (pxVar5->content->next != (xmlRelaxNGDefinePtr)0x0))
                                             && (pxVar6 = xmlRelaxNGNewDefine(ctxt,node),
                                                pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                                            pxVar6->type = XML_RELAXNG_GROUP;
                                            pxVar6->content = pxVar5->content;
                                            pxVar5->content = pxVar6;
                                          }
                                          pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                                          if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return pxVar5;
                                          }
                                          pxVar7->type = XML_RELAXNG_TEXT;
                                          pxVar7->next = pxVar5->content;
LAB_0017dba9:
                                          pxVar5->content = pxVar7;
                                          return pxVar5;
                                        }
                                        pcVar18 = "Mixed is empty\n";
                                        pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                        iVar4 = 0x3ff;
                                        goto LAB_0017da80;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0017eae0;
    }
    iVar4 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
    if (iVar4 == 0) {
      pxVar19 = node->ns;
      goto LAB_0017d9f5;
    }
    pxVar5 = xmlRelaxNGNewDefine(ctxt,node);
    if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    pxVar5->type = XML_RELAXNG_ATTRIBUTE;
    pxVar5->parent = ctxt->def;
    pxVar14 = node->children;
    if (pxVar14 != (xmlNodePtr)0x0) {
      uVar1 = ctxt->flags;
      ctxt->flags = uVar1 | 1;
      pxVar6 = xmlRelaxNGParseNameClass(ctxt,pxVar14,pxVar5);
      if ((pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) ||
         (pxVar14 = pxVar14->next, pxVar14 != (_xmlNode *)0x0)) {
        pxVar6 = xmlRelaxNGParsePattern(ctxt,pxVar14);
        if ((pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           (uVar17 = pxVar6->type + XML_RELAXNG_NOT_ALLOWED, uVar17 < 0x16)) {
          if ((0x1fff76U >> (uVar17 & 0x1f) & 1) == 0) {
            if ((0x200088U >> (uVar17 & 0x1f) & 1) == 0) {
              pcVar18 = "RNG Internal error, noop found in attribute\n";
              iVar4 = 0x3ed;
            }
            else {
              pcVar18 = "attribute has invalid content\n";
              iVar4 = 0x3eb;
            }
            xmlRngPErr(ctxt,node,iVar4,pcVar18,(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            pxVar5->content = pxVar6;
            pxVar6->parent = pxVar5;
          }
        }
        if (pxVar14->next != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x3ea,"attribute has multiple children\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        }
      }
      ctxt->flags = uVar1;
      return pxVar5;
    }
    pcVar18 = "xmlRelaxNGParseattribute: attribute has no children\n";
    iVar4 = 0x3ec;
LAB_0017da80:
    pxVar8 = (xmlChar *)0x0;
  }
LAB_0017eaf9:
  pxVar11 = (xmlChar *)0x0;
LAB_0017eafc:
  xmlRngPErr(ctxt,node,iVar4,pcVar18,pxVar8,pxVar11);
  return pxVar5;
code_r0x0017e33a:
  iVar4 = xmlStrEqual(local_50,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
  if (iVar4 == 0) {
    pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
    if (pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      pxVar6->type = XML_RELAXNG_PARAM;
      pxVar8 = xmlGetProp(node_00,"name");
      pxVar6->name = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        xmlRngPErr(ctxt,node,0x423,"param has no name\n",(xmlChar *)0x0,(xmlChar *)0x0);
      }
      pxVar8 = xmlNodeGetContent(node_00);
      pxVar6->value = pxVar8;
      ppxVar12 = &local_48->next;
      if (local_48 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        ppxVar12 = &pxVar5->attrs;
      }
      *ppxVar12 = pxVar6;
      local_48 = pxVar6;
    }
    node_00 = node_00->next;
  }
  else {
    xmlRngPErr(ctxt,node,0x422,"Type library \'%s\' does not allow type parameters\n",local_50,
               (xmlChar *)0x0);
    do {
      node_00 = node_00->next;
      if (node_00 == (_xmlNode *)0x0) {
        node_00 = (xmlNode *)0x0;
        break;
      }
      iVar4 = xmlStrEqual(node_00->name,(xmlChar *)"param");
    } while (iVar4 != 0);
  }
  goto LAB_0017e31d;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;

    if (node == NULL) {
        return (NULL);
    }
    if (IS_RELAXNG(node, "element")) {
        def = xmlRelaxNGParseElement(ctxt, node);
    } else if (IS_RELAXNG(node, "attribute")) {
        def = xmlRelaxNGParseAttribute(ctxt, node);
    } else if (IS_RELAXNG(node, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EMPTY;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_NOT_EMPTY,
                       "empty: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "text")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_TEXT;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_TEXT_HAS_CHILD,
                       "text: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "zeroOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ZEROORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "oneOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ONEORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "optional")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_OPTIONAL;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "choice")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_CHOICE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "group")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_GROUP;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "ref")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_REF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NO_NAME, "ref has no name\n",
                       NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_REF_NAME_INVALID,
                           "ref name '%s' is not an NCName\n", def->name,
                           NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NOT_EMPTY, "ref is not empty\n",
                       NULL, NULL);
        }
        if (ctxt->grammar->refs == NULL)
            ctxt->grammar->refs = xmlHashCreate(10);
        if (ctxt->grammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else {
            int tmp;

            tmp = xmlHashAddEntry(ctxt->grammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->grammar->refs, def->name);
                if (prev == NULL) {
                    if (def->name != NULL) {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions '%s'\n",
				   def->name, NULL);
                    } else {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions\n",
				   NULL, NULL);
                    }
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "data")) {
        def = xmlRelaxNGParseData(ctxt, node);
    } else if (IS_RELAXNG(node, "value")) {
        def = xmlRelaxNGParseValue(ctxt, node);
    } else if (IS_RELAXNG(node, "list")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_LIST;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "interleave")) {
        def = xmlRelaxNGParseInterleave(ctxt, node);
    } else if (IS_RELAXNG(node, "externalRef")) {
        def = xmlRelaxNGProcessExternalRef(ctxt, node);
    } else if (IS_RELAXNG(node, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "xmlRelaxNGParse: notAllowed element is not empty\n",
                       NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "grammar")) {
        xmlRelaxNGGrammarPtr grammar, old;
        xmlRelaxNGGrammarPtr oldparent;

        oldparent = ctxt->parentgrammar;
        old = ctxt->grammar;
        ctxt->parentgrammar = old;
        grammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (old != NULL) {
            ctxt->grammar = old;
            ctxt->parentgrammar = oldparent;
#if 0
            if (grammar != NULL) {
                grammar->next = old->next;
                old->next = grammar;
            }
#endif
        }
        if (grammar != NULL)
            def = grammar->start;
        else
            def = NULL;
    } else if (IS_RELAXNG(node, "parentRef")) {
        if (ctxt->parentgrammar == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_PARENT,
                       "Use of parentRef without a parent grammar\n", NULL,
                       NULL);
            return (NULL);
        }
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_PARENTREF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_NAME,
                       "parentRef has no name\n", NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NAME_INVALID,
                           "parentRef name '%s' is not an NCName\n",
                           def->name, NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NOT_EMPTY,
                       "parentRef is not empty\n", NULL, NULL);
        }
        if (ctxt->parentgrammar->refs == NULL)
            ctxt->parentgrammar->refs = xmlHashCreate(10);
        if (ctxt->parentgrammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else if (def->name != NULL) {
            int tmp;

            tmp =
                xmlHashAddEntry(ctxt->parentgrammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->parentgrammar->refs, def->name);
                if (prev == NULL) {
                    xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                               "Internal error parentRef definitions '%s'\n",
                               def->name, NULL);
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "mixed")) {
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT, "Mixed is empty\n",
                       NULL, NULL);
            def = NULL;
        } else {
            def = xmlRelaxNGParseInterleave(ctxt, node);
            if (def != NULL) {
                xmlRelaxNGDefinePtr tmp;

                if ((def->content != NULL) && (def->content->next != NULL)) {
                    tmp = xmlRelaxNGNewDefine(ctxt, node);
                    if (tmp != NULL) {
                        tmp->type = XML_RELAXNG_GROUP;
                        tmp->content = def->content;
                        def->content = tmp;
                    }
                }

                tmp = xmlRelaxNGNewDefine(ctxt, node);
                if (tmp == NULL)
                    return (def);
                tmp->type = XML_RELAXNG_TEXT;
                tmp->next = def->content;
                def->content = tmp;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_UNKNOWN_CONSTRUCT,
                   "Unexpected node %s is not a pattern\n", node->name,
                   NULL);
        def = NULL;
    }
    return (def);
}